

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void bfgs_iter_middle<sparse_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               sparse_parameters *weights)

{
  double dVar1;
  _Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> __tmp;
  long lVar2;
  long lVar3;
  _Hash_node_base *p_Var4;
  undefined8 *puVar5;
  int iVar6;
  __node_base *p_Var7;
  int iVar8;
  ulong uVar9;
  __node_base *p_Var10;
  _Hash_node_base *p_Var11;
  anon_union_4_2_947300a4 x;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (b->m == 0) {
    dVar1 = 0.0;
    dVar13 = 0.0;
    p_Var11 = (weights->_map)._M_h._M_before_begin._M_nxt;
    for (p_Var4 = p_Var11; p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
      fVar12 = *(float *)((long)&(p_Var4[2]._M_nxt)->_M_nxt + 4);
      dVar15 = (double)*(float *)((long)&p_Var4[2]._M_nxt[1]._M_nxt + 4);
      dVar14 = (double)mem[((ulong)p_Var4[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                           (long)b->mem_stride + (long)(*origin % b->mem_stride)];
      dVar1 = dVar1 + dVar14 * dVar15 * dVar14;
      dVar13 = dVar13 + dVar15 * (double)fVar12 *
                        (double)(fVar12 - mem[((ulong)p_Var4[1]._M_nxt >>
                                              ((byte)weights->_stride_shift & 0x3f)) *
                                              (long)b->mem_stride + (long)(*origin % b->mem_stride)]
                                );
    }
    fVar12 = (float)(dVar13 / dVar1);
    if ((fVar12 < 0.0) || ((~(uint)fVar12 & 0x7fc00000) == 0)) {
      fVar12 = 0.0;
    }
    for (; p_Var11 != (_Hash_node_base *)0x0; p_Var11 = p_Var11->_M_nxt) {
      mem[((ulong)p_Var11[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride
          + (long)(*origin % b->mem_stride)] = *(float *)((long)&(p_Var11[2]._M_nxt)->_M_nxt + 4);
      *(float *)&p_Var11[2]._M_nxt[1]._M_nxt = *(float *)&p_Var11[2]._M_nxt[1]._M_nxt * fVar12;
      p_Var4 = p_Var11[2]._M_nxt;
      *(float *)&p_Var4[1]._M_nxt =
           *(float *)&p_Var4[1]._M_nxt -
           *(float *)((long)&p_Var4[1]._M_nxt + 4) * *(float *)((long)&p_Var4->_M_nxt + 4);
      *(undefined4 *)((long)&(p_Var11[2]._M_nxt)->_M_nxt + 4) = 0;
    }
    if (all->quiet == false) {
      fprintf(_stderr,"%f\t",SUB84((double)fVar12,0));
      return;
    }
  }
  else {
    if (all->quiet == false) {
      fprintf(_stderr,"%-10s\t","");
    }
    p_Var7 = &(weights->_map)._M_h._M_before_begin;
    dVar13 = 0.0;
    dVar14 = 0.0;
    dVar1 = 0.0;
    p_Var10 = p_Var7;
    while( true ) {
      p_Var10 = p_Var10->_M_nxt;
      if (p_Var10 == (__node_base *)0x0) break;
      lVar2 = ((ulong)p_Var10[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
              (long)b->mem_stride;
      lVar3 = (long)(*origin % b->mem_stride);
      mem[lVar2 + lVar3] =
           *(float *)((long)&(*(_Hash_node_base **)
                               &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)->_M_nxt
                     + 4) - mem[lVar2 + lVar3];
      lVar3 = (long)((*origin + 1) % b->mem_stride);
      mem[lVar2 + lVar3] =
           *(float *)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)->_M_nxt -
           mem[lVar2 + lVar3];
      *(undefined4 *)
       &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)[1].
        _M_nxt = *(undefined4 *)
                  ((long)&(*(_Hash_node_base **)
                            &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)->_M_nxt +
                  4);
      dVar15 = (double)mem[lVar2 + *origin % b->mem_stride];
      dVar1 = dVar1 + dVar15 * (double)mem[lVar2 + (*origin + 1) % b->mem_stride];
      dVar13 = dVar13 + (double)mem[lVar2 + (*origin + 1) % b->mem_stride] *
                        (double)*(float *)((long)&(*(_Hash_node_base **)
                                                    &((_Prime_rehash_policy *)(p_Var10 + 2))->
                                                     _M_max_load_factor)->_M_nxt + 4);
      dVar14 = dVar14 + dVar15 * dVar15 *
                        (double)*(float *)((long)&(*(_Hash_node_base **)
                                                    &((_Prime_rehash_policy *)(p_Var10 + 2))->
                                                     _M_max_load_factor)[1]._M_nxt + 4);
    }
    if ((dVar1 <= 0.0) || (dVar14 <= 0.0)) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &PTR__exception_002a6518;
      __cxa_throw(puVar5,&curv_exception::typeinfo,std::exception::~exception);
    }
    *rho = 1.0 / dVar1;
    for (lVar2 = 0; lVar3 = (long)*lastj, lVar2 < lVar3; lVar2 = lVar2 + 1) {
      alpha[lVar2] = dVar13 * rho[lVar2];
      dVar13 = 0.0;
      p_Var10 = p_Var7;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        lVar3 = ((ulong)p_Var10[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                (long)b->mem_stride;
        *(float *)&(*(_Hash_node_base **)
                     &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)[1]._M_nxt =
             *(float *)&(*(_Hash_node_base **)
                          &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)[1]._M_nxt -
             (float)alpha[lVar2] * mem[lVar3 + (*origin + (int)lVar2 * 2) % b->mem_stride];
        dVar13 = dVar13 + (double)*(float *)&(*(_Hash_node_base **)
                                               &((_Prime_rehash_policy *)(p_Var10 + 2))->
                                                _M_max_load_factor)[1]._M_nxt *
                          (double)mem[lVar3 + (*origin + (int)lVar2 * 2 + 3) % b->mem_stride];
      }
    }
    alpha[lVar3] = dVar13 * rho[lVar3];
    dVar13 = 0.0;
    p_Var10 = p_Var7;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      lVar2 = ((ulong)p_Var10[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
              (long)b->mem_stride;
      *(float *)&(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)
                 [1]._M_nxt =
           *(float *)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)[1]._M_nxt -
           (float)alpha[*lastj] * mem[lVar2 + (*lastj * 2 + *origin) % b->mem_stride];
      p_Var11 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor;
      *(float *)&p_Var11[1]._M_nxt =
           *(float *)((long)&p_Var11[1]._M_nxt + 4) * (float)(dVar1 / dVar14) *
           *(float *)&p_Var11[1]._M_nxt;
      dVar13 = dVar13 + (double)*(float *)&(*(_Hash_node_base **)
                                             &((_Prime_rehash_policy *)(p_Var10 + 2))->
                                              _M_max_load_factor)[1]._M_nxt *
                        (double)mem[lVar2 + (*lastj * 2 + *origin) % b->mem_stride];
    }
    for (uVar9 = (ulong)(uint)*lastj; iVar8 = (int)uVar9, 0 < iVar8; uVar9 = uVar9 - 1) {
      dVar14 = dVar13 * rho[uVar9];
      dVar1 = alpha[uVar9];
      dVar13 = 0.0;
      p_Var10 = p_Var7;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        lVar2 = ((ulong)p_Var10[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                (long)b->mem_stride;
        *(float *)&(*(_Hash_node_base **)
                     &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)[1]._M_nxt =
             mem[lVar2 + (*origin + iVar8 * 2 + 1) % b->mem_stride] * (float)(dVar1 - dVar14) +
             *(float *)&(*(_Hash_node_base **)
                          &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)[1]._M_nxt;
        dVar13 = dVar13 + (double)*(float *)&(*(_Hash_node_base **)
                                               &((_Prime_rehash_policy *)(p_Var10 + 2))->
                                                _M_max_load_factor)[1]._M_nxt *
                          (double)mem[lVar2 + (*origin + iVar8 * 2 + -2) % b->mem_stride];
      }
    }
    dVar1 = *rho;
    dVar14 = *alpha;
    p_Var10 = p_Var7;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      *(float *)&(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)
                 [1]._M_nxt =
           mem[((ulong)p_Var10[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
               (long)b->mem_stride + (long)((*origin + 1) % b->mem_stride)] *
           -(float)(dVar14 - dVar13 * dVar1) -
           *(float *)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor)[1]._M_nxt;
    }
    iVar6 = b->m + -1;
    iVar8 = *lastj + 1;
    if (iVar6 <= *lastj) {
      iVar8 = iVar6;
    }
    *lastj = iVar8;
    *origin = (*origin + b->mem_stride + -2) % b->mem_stride;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      lVar2 = ((ulong)p_Var7[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
              (long)b->mem_stride;
      mem[lVar2 + *origin % b->mem_stride] =
           *(float *)((long)&(*(_Hash_node_base **)
                               &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor)->_M_nxt
                     + 4);
      mem[lVar2 + (*origin + 1) % b->mem_stride] =
           *(float *)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor)->_M_nxt;
      *(undefined4 *)
       ((long)&(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor)->
               _M_nxt + 4) = 0;
    }
    for (uVar9 = (ulong)(uint)*lastj; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      rho[uVar9] = rho[uVar9 - 1];
    }
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}